

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int32_t zng_inflateEnd(zng_stream *strm)

{
  int iVar1;
  int32_t iVar2;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    free_inflate(strm);
    iVar2 = 0;
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateEnd)(PREFIX3(stream) *strm) {
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;

    /* Free allocated buffers */
    free_inflate(strm);

    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}